

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool roaring_bitmap_contains_bulk(roaring_bitmap_t *r,roaring_bulk_context_t *context,uint32_t val)

{
  uint8_t uVar1;
  uint16_t *puVar2;
  long lVar3;
  ushort uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  ushort uVar8;
  uint uVar9;
  uint *puVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  bool bVar14;
  
  uVar9 = val >> 0x10;
  puVar10 = (uint *)context->container;
  iVar5 = -1;
  if (puVar10 != (uint *)0x0) {
    if (uVar9 == context->key) {
      uVar1 = context->typecode;
      goto LAB_00101d26;
    }
    if (context->key < uVar9) {
      iVar5 = context->idx;
    }
  }
  uVar6 = (r->high_low_container).size;
  puVar2 = (r->high_low_container).keys;
  uVar12 = iVar5 + 1;
  uVar11 = uVar12;
  if (((int)uVar12 < (int)uVar6) && (uVar4 = (ushort)(val >> 0x10), puVar2[(int)uVar12] < uVar4)) {
    uVar11 = iVar5 + 2;
    iVar5 = 1;
    if ((int)uVar11 < (int)uVar6) {
      iVar13 = 1;
      do {
        uVar7 = (ulong)uVar11;
        uVar8 = puVar2[(int)uVar11];
        iVar5 = iVar13;
        if (uVar4 <= uVar8) goto LAB_00101ce1;
        iVar5 = iVar13 * 2;
        uVar11 = uVar12 + iVar13 * 2;
        iVar13 = iVar5;
      } while ((int)uVar11 < (int)uVar6);
    }
    uVar7 = (long)(int)uVar6 - 1;
    uVar8 = puVar2[(long)(int)uVar6 + -1];
LAB_00101ce1:
    uVar11 = (uint)uVar7;
    if (uVar8 != uVar4) {
      if (uVar8 < uVar4) {
        return false;
      }
      if ((iVar5 >> 1) + uVar12 + 1 != uVar11) {
        uVar12 = (iVar5 >> 1) + uVar12;
        do {
          uVar11 = (int)(uVar12 + (uint)uVar7) >> 1;
          if (puVar2[(int)uVar11] == uVar4) break;
          if (puVar2[(int)uVar11] < uVar4) {
            uVar12 = uVar11;
            uVar11 = (uint)uVar7;
          }
          uVar7 = (ulong)uVar11;
        } while (uVar12 + 1 != uVar11);
      }
    }
  }
  if (uVar11 == uVar6) {
    return false;
  }
  uVar12 = uVar11 & 0xffff;
  uVar1 = (r->high_low_container).typecodes[uVar12];
  puVar10 = (uint *)(r->high_low_container).containers[uVar12];
  context->container = puVar10;
  context->typecode = uVar1;
  context->idx = uVar11;
  uVar4 = puVar2[uVar12];
  context->key = uVar4;
  if (uVar9 != uVar4) {
    return false;
  }
LAB_00101d26:
  if (uVar1 == '\x04') {
    uVar1 = (uint8_t)puVar10[2];
    puVar10 = *(uint **)puVar10;
  }
  lVar3 = *(long *)(puVar10 + 2);
  uVar4 = (ushort)val;
  if (uVar1 != '\x03') {
    if (uVar1 != '\x02') {
      return (*(ulong *)(lVar3 + (ulong)(val >> 3 & 0x1ff8)) >> ((ulong)val & 0x3f) & 1) != 0;
    }
    uVar9 = 0;
    uVar12 = *puVar10;
    do {
      iVar5 = uVar9 + 0x10;
      while( true ) {
        if ((int)uVar12 <= iVar5) {
          if ((int)uVar12 <= (int)uVar9) {
            return false;
          }
          uVar7 = (ulong)uVar9;
          while( true ) {
            uVar8 = *(ushort *)(lVar3 + uVar7 * 2);
            bVar14 = uVar8 == uVar4;
            if (bVar14) {
              return bVar14;
            }
            if (uVar4 <= uVar8 && !bVar14) break;
            iVar5 = (int)uVar7;
            uVar7 = uVar7 + 1;
            if (uVar12 - 1 == iVar5) {
              return bVar14;
            }
          }
          return bVar14;
        }
        uVar6 = (uVar12 - 1) + uVar9;
        uVar11 = uVar6 >> 1;
        uVar8 = *(ushort *)(lVar3 + (ulong)(uVar6 & 0xfffffffe));
        if (uVar4 <= uVar8) break;
        uVar9 = uVar11 + 1;
        iVar5 = uVar11 + 0x11;
      }
      uVar12 = uVar11;
    } while (uVar4 < uVar8);
    return true;
  }
  if (0 < (int)*puVar10) {
    iVar5 = *puVar10 - 1;
    uVar7 = 0;
    do {
      uVar9 = (uint)(iVar5 + (int)uVar7) >> 1;
      uVar8 = *(ushort *)(lVar3 + (ulong)uVar9 * 4);
      if (uVar8 < uVar4) {
        uVar7 = (ulong)(uVar9 + 1);
      }
      else {
        if (uVar8 <= uVar4) {
          return true;
        }
        iVar5 = uVar9 - 1;
      }
    } while ((int)uVar7 <= iVar5);
    if (((int)uVar7 != 0) &&
       ((int)((val & 0xffff) - (uint)*(ushort *)(lVar3 + -4 + uVar7 * 4)) <=
        (int)(uint)*(ushort *)(lVar3 + -2 + uVar7 * 4))) {
      return true;
    }
  }
  return false;
}

Assistant:

bool roaring_bitmap_contains_bulk(const roaring_bitmap_t *r,
                                  roaring_bulk_context_t *context,
                                  uint32_t val) {
    uint16_t key = val >> 16;
    if (context->container == NULL || context->key != key) {
        int32_t start_idx = -1;
        if (context->container != NULL && context->key < key) {
            start_idx = context->idx;
        }
        int idx = ra_advance_until(&r->high_low_container, key, start_idx);
        if (idx == ra_get_size(&r->high_low_container)) {
            return false;
        }
        uint8_t typecode;
        context->container = ra_get_container_at_index(
            &r->high_low_container, (uint16_t)idx, &typecode);
        context->typecode = typecode;
        context->idx = idx;
        context->key =
            ra_get_key_at_index(&r->high_low_container, (uint16_t)idx);
        // ra_advance_until finds the next key >= the target, we found a later
        // container.
        if (context->key != key) {
            return false;
        }
    }
    // context is now set up
    return container_contains(context->container, val & 0xFFFF,
                              context->typecode);
}